

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_regular_transfer(Curl_easy *data,_Bool *dophase_done)

{
  _Bool local_1d;
  CURLcode local_1c;
  _Bool connected;
  _Bool *p_Stack_18;
  CURLcode result;
  _Bool *dophase_done_local;
  Curl_easy *data_local;
  
  local_1c = 0;
  local_1d = false;
  (data->req).size = -1;
  p_Stack_18 = dophase_done;
  dophase_done_local = (_Bool *)data;
  Curl_pgrsSetUploadCounter(data,0);
  Curl_pgrsSetDownloadCounter((Curl_easy *)dophase_done_local,0);
  Curl_pgrsSetUploadSize((Curl_easy *)dophase_done_local,-1);
  Curl_pgrsSetDownloadSize((Curl_easy *)dophase_done_local,-1);
  local_1c = imap_perform((Curl_easy *)dophase_done_local,&local_1d,p_Stack_18);
  if ((local_1c == CURLE_OK) && ((*p_Stack_18 & 1U) != 0)) {
    local_1c = imap_dophase_done((Curl_easy *)dophase_done_local,(_Bool)(local_1d & 1));
  }
  return local_1c;
}

Assistant:

static CURLcode imap_regular_transfer(struct Curl_easy *data,
                                      bool *dophase_done)
{
  CURLcode result = CURLE_OK;
  bool connected = FALSE;

  /* Make sure size is unknown at this point */
  data->req.size = -1;

  /* Set the progress data */
  Curl_pgrsSetUploadCounter(data, 0);
  Curl_pgrsSetDownloadCounter(data, 0);
  Curl_pgrsSetUploadSize(data, -1);
  Curl_pgrsSetDownloadSize(data, -1);

  /* Carry out the perform */
  result = imap_perform(data, &connected, dophase_done);

  /* Perform post DO phase operations if necessary */
  if(!result && *dophase_done)
    result = imap_dophase_done(data, connected);

  return result;
}